

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode add_next_timeout(timeval now,Curl_multi *multi,Curl_easy *d)

{
  timeval *ptVar1;
  curl_llist *list;
  void *pvVar2;
  curl_llist_element *pcVar3;
  __suseconds_t _Var4;
  Curl_easy *in_RAX;
  time_t tVar5;
  curl_llist_element *pcVar6;
  
  ptVar1 = &(d->state).expiretime;
  pcVar6 = (d->state).timeoutlist.head;
  if (pcVar6 != (curl_llist_element *)0x0) {
    list = &(d->state).timeoutlist;
    do {
      pvVar2 = pcVar6->ptr;
      pcVar3 = pcVar6->next;
      tVar5 = curlx_tvdiff(*(timeval *)((long)pvVar2 + 0x18),now);
      if (0 < tVar5) break;
      Curl_llist_remove(list,pcVar6,(void *)0x0);
      pcVar6 = pcVar3;
    } while (pcVar3 != (curl_llist_element *)0x0);
    pcVar6 = list->head;
    in_RAX = d;
    if (pcVar6 != (curl_llist_element *)0x0) {
      _Var4 = *(__suseconds_t *)((long)pvVar2 + 0x20);
      ptVar1->tv_sec = *(__time_t *)((long)pvVar2 + 0x18);
      (d->state).expiretime.tv_usec = _Var4;
      Curl_llist_remove(list,pcVar6,(void *)0x0);
      in_RAX = (Curl_easy *)
               Curl_splayinsert((d->state).expiretime,multi->timetree,&(d->state).timenode);
      multi->timetree = (Curl_tree *)in_RAX;
      goto LAB_00111793;
    }
  }
  ptVar1->tv_sec = 0;
  (d->state).expiretime.tv_usec = 0;
LAB_00111793:
  return (CURLMcode)in_RAX;
}

Assistant:

static CURLMcode add_next_timeout(struct timeval now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct timeval *tv = &d->state.expiretime;
  struct curl_llist *list = &d->state.timeoutlist;
  struct curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    time_t diff;
    node = (struct time_node *)e->ptr;
    diff = curlx_tvdiff(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* remove first entry from list */
    Curl_llist_remove(list, e, NULL);

    /* insert this node again into the splay */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}